

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

_Bool valid_repne(cs_struct *h,uint opcode)

{
  unsigned_short uVar1;
  uint uVar2;
  int i;
  uint id;
  uint opcode_local;
  cs_struct *h_local;
  
  uVar1 = insn_find(insns,0x1735,opcode,&h->insn_cache);
  if (uVar1 == 0) {
    return false;
  }
  uVar2 = (uint)insns[(int)(uint)uVar1].mapid;
  if (uVar2 != 0x60) {
    if (uVar2 == 0x61) {
      if (opcode == 0x233) {
        return true;
      }
      return false;
    }
    if (((((uVar2 != 0x62) && (uVar2 != 100)) && (1 < uVar2 - 0x1cf)) &&
        ((uVar2 != 0x1d3 && (uVar2 != 0x1d5)))) && (uVar2 != 0x266)) {
      if (uVar2 == 0x267) {
        if (opcode == 0x9f2) {
          return true;
        }
        return false;
      }
      if ((1 < uVar2 - 0x268) && (3 < uVar2 - 0x29b)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

static bool valid_repne(cs_struct *h, unsigned int opcode)
{
	unsigned int id;
	int i = insn_find(insns, ARR_SIZE(insns), opcode, &h->insn_cache);
	if (i != 0) {
		id = insns[i].mapid;
		switch(id) {
			default:
				return false;

			case X86_INS_CMPSB:
			case X86_INS_CMPSW:
			case X86_INS_CMPSQ:

			case X86_INS_SCASB:
			case X86_INS_SCASW:
			case X86_INS_SCASQ:

			case X86_INS_MOVSB:
			case X86_INS_MOVSW:
			case X86_INS_MOVSD:
			case X86_INS_MOVSQ:

			case X86_INS_STOSB:
			case X86_INS_STOSW:
			case X86_INS_STOSD:
			case X86_INS_STOSQ:

				return true;

			case X86_INS_CMPSD:
				if (opcode == X86_CMPSL) // REP CMPSD
					return true;
				return false;

			case X86_INS_SCASD:
				if (opcode == X86_SCASL) // REP SCASD
					return true;
				return false;
		}
	}

	// not found
	return false;
}